

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_base.h
# Opt level: O1

void __thiscall
LineBase2D<float>::LineBase2D
          (LineBase2D<float> *this,PointBase2D<float> *point1,PointBase2D<float> *point2)

{
  PointBase2D<float> PVar1;
  bool bVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  this->_position = *point1;
  (this->_direction).x = 0.0;
  (this->_direction).y = 0.0;
  bVar2 = pvmath::isEqual<float>(&point1->x,&point2->x);
  if (bVar2) {
    bVar2 = pvmath::isEqual<float>(&point1->y,&point2->y);
    if (bVar2) {
      auVar4 = SUB6416(ZEXT464(0x3f800000),0);
      goto LAB_001e2c5d;
    }
  }
  auVar4._8_8_ = 0;
  auVar4._0_4_ = point2->x;
  auVar4._4_4_ = point2->y;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = point1->x;
  auVar7._4_4_ = point1->y;
  auVar7 = vsubps_avx(auVar4,auVar7);
  auVar5._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar5._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar5._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar5._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar4 = vmovshdup_avx(auVar5);
  auVar4 = vfmadd231ss_fma(auVar4,auVar7,auVar7);
  if (auVar4._0_4_ < 0.0) {
    fVar3 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar3 = auVar4._0_4_;
  }
  auVar6._4_4_ = fVar3;
  auVar6._0_4_ = fVar3;
  auVar6._8_4_ = fVar3;
  auVar6._12_4_ = fVar3;
  auVar4 = vdivps_avx(auVar7,auVar6);
LAB_001e2c5d:
  PVar1 = (PointBase2D<float>)vmovlps_avx(auVar4);
  this->_direction = PVar1;
  return;
}

Assistant:

LineBase2D( const PointBase2D<_Type> & point1 = PointBase2D<_Type>(), const PointBase2D<_Type> & point2 = PointBase2D<_Type>() )
        : _position( point1 )
    {
        if ( point1 == point2 ) {
            _direction = PointBase2D<_Type>( 1, 0 ); // we could raise an exception here instead
        }
        else {
            const _Type xDiff = point2.x - point1.x;
            const _Type yDiff = point2.y - point1.y;
            const _Type length = std::sqrt( xDiff * xDiff + yDiff * yDiff ); // here we might need more specific code for non-double cases
            _direction = PointBase2D<_Type>( xDiff / length, yDiff / length );
        }
    }